

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

bool Fossilize::filter_extension
               (char *ext,bool want_amd_shader_info,
               vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *all_exts,
               uint32_t api_version)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  bVar1 = false;
  lVar3 = 0;
  do {
    iVar2 = strcmp(*(char **)((long)filter_extension::vulkan_11_only_extensions + lVar3),ext);
    if (iVar2 == 0) {
      bVar1 = true;
      break;
    }
    bVar4 = lVar3 != 0x60;
    lVar3 = lVar3 + 8;
  } while (bVar4);
  iVar2 = strcmp(ext,"VK_AMD_negative_viewport_height");
  if ((((iVar2 == 0) || (iVar2 = strcmp(ext,"VK_NV_ray_tracing"), iVar2 == 0)) ||
      ((iVar2 = strcmp(ext,"VK_EXT_buffer_device_address"), iVar2 == 0 &&
       (bVar4 = find_extension(all_exts,"VK_KHR_buffer_device_address"), bVar4)))) ||
     ((api_version < 0x401000 && (bVar1)))) {
    bVar1 = false;
  }
  else {
    iVar2 = strcmp(ext,"VK_AMD_shader_info");
    bVar1 = iVar2 != 0 || want_amd_shader_info;
  }
  return bVar1;
}

Assistant:

static bool filter_extension(const char *ext, bool want_amd_shader_info,
                             const vector<VkExtensionProperties> &all_exts, uint32_t api_version)
{
	static const char *vulkan_11_only_extensions[] = {
		VK_KHR_SHADER_SUBGROUP_EXTENDED_TYPES_EXTENSION_NAME,
		VK_KHR_SPIRV_1_4_EXTENSION_NAME,
		VK_KHR_SHARED_PRESENTABLE_IMAGE_EXTENSION_NAME,
		VK_KHR_SHADER_FLOAT_CONTROLS_EXTENSION_NAME,
		VK_KHR_ACCELERATION_STRUCTURE_EXTENSION_NAME,
		VK_KHR_RAY_TRACING_PIPELINE_EXTENSION_NAME,
		VK_KHR_RAY_QUERY_EXTENSION_NAME,
		VK_KHR_MAINTENANCE_4_EXTENSION_NAME,
		VK_KHR_SHADER_SUBGROUP_UNIFORM_CONTROL_FLOW_EXTENSION_NAME,
		VK_EXT_SUBGROUP_SIZE_CONTROL_EXTENSION_NAME,
		VK_NV_SHADER_SM_BUILTINS_EXTENSION_NAME,
		VK_NV_SHADER_SUBGROUP_PARTITIONED_EXTENSION_NAME,
		VK_NV_DEVICE_GENERATED_COMMANDS_EXTENSION_NAME,
	};

	bool ext_is_vulkan_11_only = false;
	for (auto *candidate : vulkan_11_only_extensions)
	{
		if (strcmp(candidate, ext) == 0)
		{
			ext_is_vulkan_11_only = true;
			break;
		}
	}

	if (strcmp(ext, VK_AMD_NEGATIVE_VIEWPORT_HEIGHT_EXTENSION_NAME) == 0)
	{
		// AMD_negative_viewport_height: Obsolete, illegal to enable along maintenance1.
		return false;
	}
	else if (strcmp(ext, VK_NV_RAY_TRACING_EXTENSION_NAME) == 0)
	{
		// We never enable the features, and it is known to cause some shenanigans with pipeline replay.
		return false;
	}
	else if (strcmp(ext, VK_EXT_BUFFER_DEVICE_ADDRESS_EXTENSION_NAME) == 0 &&
	         find_extension(all_exts, VK_KHR_BUFFER_DEVICE_ADDRESS_EXTENSION_NAME))
	{
		// Cannot enable both EXT and KHR versions, validation complains.
		return false;
	}
	else if (api_version < VK_API_VERSION_1_1 && ext_is_vulkan_11_only)
	{
		return false;
	}
	else if (strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0 && !want_amd_shader_info)
	{
		// Mesa disables the pipeline cache when VK_AMD_shader_info is used, so disable this extension unless we need it.
		return false;
	}

	return true;
}